

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O2

void __thiscall Assimp::ASEImporter::GenerateDefaultMaterial(ASEImporter *this)

{
  pointer pMVar1;
  bool bVar2;
  pointer pMVar3;
  Parser *pPVar4;
  allocator<char> local_319;
  string local_318;
  Material local_2f8;
  
  pPVar4 = this->mParser;
  if (pPVar4 != (Parser *)0x0) {
    bVar2 = false;
    for (pMVar3 = (pPVar4->m_vMeshes).
                  super__Vector_base<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pMVar3 != (pPVar4->m_vMeshes).
                  super__Vector_base<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>._M_impl.
                  super__Vector_impl_data._M_finish; pMVar3 = pMVar3 + 1) {
      if ((pMVar3->bSkip == false) && (pMVar3->iMaterialIndex == 0xffffffff)) {
        pMVar3->iMaterialIndex =
             (uint)(((long)(pPVar4->m_vMaterials).
                           super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pPVar4->m_vMaterials).
                          super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x2e0);
        pPVar4 = this->mParser;
        bVar2 = true;
      }
    }
    if ((bVar2) ||
       ((pPVar4->m_vMaterials).
        super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (pPVar4->m_vMaterials).
        super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl.
        super__Vector_impl_data._M_finish)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_318,"DefaultMaterial",&local_319);
      ASE::Material::Material(&local_2f8,&local_318);
      std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::
      emplace_back<Assimp::ASE::Material>(&pPVar4->m_vMaterials,&local_2f8);
      ASE::Material::~Material(&local_2f8);
      std::__cxx11::string::~string((string *)&local_318);
      pMVar1 = (this->mParser->m_vMaterials).
               super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pMVar1[-1].super_Material.mDiffuse.r = 0.6;
      pMVar1[-1].super_Material.mDiffuse.g = 0.6;
      pMVar1[-1].super_Material.mDiffuse.b = 0.6;
      pMVar1[-1].super_Material.mSpecular.r = 1.0;
      pMVar1[-1].super_Material.mSpecular.g = 1.0;
      *(undefined8 *)&pMVar1[-1].super_Material.mSpecular.b = 0x3d4ccccd3f800000;
      pMVar1[-1].super_Material.mAmbient.g = 0.05;
      pMVar1[-1].super_Material.mAmbient.b = 0.05;
      pMVar1[-1].super_Material.mShading = Gouraud;
    }
    return;
  }
  __assert_fail("__null != mParser",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/ASE/ASELoader.cpp"
                ,0x10c,"void Assimp::ASEImporter::GenerateDefaultMaterial()");
}

Assistant:

void ASEImporter::GenerateDefaultMaterial()
{
    ai_assert(NULL != mParser);

    bool bHas = false;
    for (std::vector<ASE::Mesh>::iterator i =  mParser->m_vMeshes.begin();i != mParser->m_vMeshes.end();++i) {
        if ((*i).bSkip)continue;
        if (ASE::Face::DEFAULT_MATINDEX == (*i).iMaterialIndex) {
            (*i).iMaterialIndex = (unsigned int)mParser->m_vMaterials.size();
            bHas = true;
        }
    }
    if (bHas || mParser->m_vMaterials.empty())  {
        // add a simple material without submaterials to the parser's list
        mParser->m_vMaterials.push_back ( ASE::Material(AI_DEFAULT_MATERIAL_NAME) );
        ASE::Material& mat = mParser->m_vMaterials.back();

        mat.mDiffuse  = aiColor3D(0.6f,0.6f,0.6f);
        mat.mSpecular = aiColor3D(1.0f,1.0f,1.0f);
        mat.mAmbient  = aiColor3D(0.05f,0.05f,0.05f);
        mat.mShading  = Discreet3DS::Gouraud;
    }
}